

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<const_QtPrivate::QMetaTypeInterface_*>::reallocate
          (QPodArrayOps<const_QtPrivate::QMetaTypeInterface_*> *this,qsizetype alloc,
          AllocationOption option)

{
  pair<QTypedArrayData<const_QtPrivate::QMetaTypeInterface_*>_*,_const_QtPrivate::QMetaTypeInterface_**>
  pVar1;
  
  pVar1 = QTypedArrayData<const_QtPrivate::QMetaTypeInterface_*>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*>).d,
                     (this->super_QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*>).ptr,
                     alloc,option);
  if (pVar1.second != (QMetaTypeInterface **)0x0) {
    (this->super_QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*>).d = pVar1.first;
    (this->super_QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }